

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void new_range(int ndim,int *dims,int *lo,int *hi,int *new_lo,int *new_hi)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int diff;
  int range;
  int toss;
  int dim;
  int local_44;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    if (in_EDI <= local_34) {
      return;
    }
    iVar1 = (*(int *)(in_RCX + (long)local_34 * 4) - *(int *)(in_RDX + (long)local_34 * 4)) + 1;
    if (*(int *)(in_RSI + (long)local_34 * 4) < iVar1) break;
    iVar2 = *(int *)(in_RSI + (long)local_34 * 4) - iVar1;
    if (iVar2 < 1) {
      local_44 = *(int *)(in_RDX + (long)local_34 * 4);
    }
    else {
      local_44 = rand();
      local_44 = local_44 % iVar2;
    }
    *(int *)(in_R8 + (long)local_34 * 4) = local_44;
    *(int *)(in_R9 + (long)local_34 * 4) = local_44 + iVar1 + -1;
    if (*(int *)(in_RSI + (long)local_34 * 4) <= *(int *)(in_R9 + (long)local_34 * 4)) {
      __assert_fail("new_hi[dim] < dims[dim]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                    ,99,"void new_range(int, int *, int *, int *, int *, int *)");
    }
    if (iVar1 != (*(int *)(in_R9 + (long)local_34 * 4) - *(int *)(in_R8 + (long)local_34 * 4)) + 1)
    {
      __assert_fail("diff == (new_hi[dim] -new_lo[dim]+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                    ,100,"void new_range(int, int *, int *, int *, int *, int *)");
    }
    local_34 = local_34 + 1;
  }
  __assert_fail("diff <= dims[dim]",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x5e,"void new_range(int, int *, int *, int *, int *, int *)");
}

Assistant:

void new_range(int ndim, int dims[], int lo[], int hi[],
                             int new_lo[], int new_hi[])
{
    int dim;
    for(dim=0; dim <ndim;dim++){
        int toss, range;
        int diff = hi[dim] -lo[dim]+1;
        assert(diff <= dims[dim]);
                range = dims[dim]-diff;
                toss = (range > 0)? rand()%range : lo[dim];
        new_lo[dim] = toss;
        new_hi[dim] = toss + diff -1;
        assert(new_hi[dim] < dims[dim]);
        assert(diff == (new_hi[dim] -new_lo[dim]+1));
    }
}